

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

bool __thiscall
google::protobuf::internal::VerifyUTF8(internal *this,StringPiece str,char *field_name)

{
  bool bVar1;
  undefined1 local_48 [8];
  StringPiece str_local;
  
  str_local.ptr_ = str.ptr_;
  local_48 = (undefined1  [8])this;
  StringPiece::ToString_abi_cxx11_((string *)&str_local.length_,(StringPiece *)local_48);
  bVar1 = IsStructurallyValidUTF8((string *)&str_local.length_);
  std::__cxx11::string::~string((string *)&str_local.length_);
  if (!bVar1) {
    PrintUTF8ErrorLog((char *)str.length_,"parsing",false);
  }
  return bVar1;
}

Assistant:

bool VerifyUTF8(StringPiece str, const char* field_name) {
  if (!IsStructurallyValidUTF8(str)) {
    PrintUTF8ErrorLog(field_name, "parsing", false);
    return false;
  }
  return true;
}